

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * json::anon_unknown_1::json_escape(string *str)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  ulong in_RSI;
  string *in_RDI;
  uint i;
  string *output;
  uint local_18;
  
  std::__cxx11::string::string((string *)in_RDI);
  for (local_18 = 0; uVar2 = std::__cxx11::string::length(), local_18 < uVar2;
      local_18 = local_18 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
    cVar1 = *pcVar3;
    if (cVar1 == '\b') {
      std::__cxx11::string::operator+=((string *)in_RDI,"\\b");
    }
    else if (cVar1 == '\t') {
      std::__cxx11::string::operator+=((string *)in_RDI,"\\t");
    }
    else if (cVar1 == '\n') {
      std::__cxx11::string::operator+=((string *)in_RDI,"\\n");
    }
    else if (cVar1 == '\f') {
      std::__cxx11::string::operator+=((string *)in_RDI,"\\f");
    }
    else if (cVar1 == '\r') {
      std::__cxx11::string::operator+=((string *)in_RDI,"\\r");
    }
    else if (cVar1 == '\"') {
      std::__cxx11::string::operator+=((string *)in_RDI,"\\\"");
    }
    else if (cVar1 == '\\') {
      std::__cxx11::string::operator+=((string *)in_RDI,"\\\\");
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
      std::__cxx11::string::operator+=((string *)in_RDI,*pcVar3);
    }
  }
  return in_RDI;
}

Assistant:

string json_escape( const string &str ) {
        string output;
        for( unsigned i = 0; i < str.length(); ++i )
            switch( str[i] ) {
                case '\"': output += "\\\""; break;
                case '\\': output += "\\\\"; break;
                case '\b': output += "\\b";  break;
                case '\f': output += "\\f";  break;
                case '\n': output += "\\n";  break;
                case '\r': output += "\\r";  break;
                case '\t': output += "\\t";  break;
                default  : output += str[i]; break;
            }
        return output;
    }